

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddFuncs.c
# Opt level: O2

DdNode * cuddZddProduct(DdManager *dd,DdNode *f,DdNode *g)

{
  uint v;
  int iVar1;
  DdNode *pDVar2;
  DdNode *pDVar3;
  DdNode *n;
  DdNode *pDVar4;
  DdNode *f_00;
  DdNode *gd;
  DdNode *g1;
  DdNode *g0;
  DdNode *fd;
  DdNode *f1;
  DdNode *f0;
  DdNode *local_a0;
  DdNode *local_60;
  DdNode *local_58;
  DdNode *local_50;
  DdNode *local_48;
  DdNode *local_40;
  DdNode *local_38 [7];
  
  do {
    f_00 = f;
    f = g;
    pDVar2 = dd->zero;
    if (pDVar2 == f || pDVar2 == f_00) {
      return pDVar2;
    }
    if (dd->one == f_00) {
      return f;
    }
    if (dd->one == f) {
      return f_00;
    }
    g = f_00;
  } while (dd->permZ[f->index] < dd->permZ[f_00->index]);
  pDVar2 = cuddCacheLookup2Zdd(dd,cuddZddProduct,f_00,f);
  if (pDVar2 != (DdNode *)0x0) {
    return pDVar2;
  }
  v = f_00->index;
  iVar1 = cuddZddGetCofactors3(dd,f_00,v,&local_40,local_38,&local_48);
  if (iVar1 != 0) {
    return (DdNode *)0x0;
  }
  Cudd_Ref(local_40);
  Cudd_Ref(local_38[0]);
  Cudd_Ref(local_48);
  iVar1 = cuddZddGetCofactors3(dd,f,v,&local_58,&local_50,&local_60);
  if (iVar1 != 0) {
    Cudd_RecursiveDerefZdd(dd,local_40);
    Cudd_RecursiveDerefZdd(dd,local_38[0]);
    pDVar3 = local_48;
    goto LAB_006354d9;
  }
  Cudd_Ref(local_58);
  Cudd_Ref(local_50);
  Cudd_Ref(local_60);
  local_a0 = cuddZddProduct(dd,local_48,local_60);
  if (local_a0 == (DdNode *)0x0) {
    Cudd_RecursiveDerefZdd(dd,local_40);
    Cudd_RecursiveDerefZdd(dd,local_38[0]);
    Cudd_RecursiveDerefZdd(dd,local_48);
    Cudd_RecursiveDerefZdd(dd,local_58);
LAB_0063588a:
    Cudd_RecursiveDerefZdd(dd,local_50);
    pDVar3 = local_60;
    goto LAB_006354d9;
  }
  Cudd_Ref(local_a0);
  pDVar2 = cuddZddProduct(dd,local_38[0],local_50);
  if (pDVar2 == (DdNode *)0x0) {
    Cudd_RecursiveDerefZdd(dd,local_40);
    Cudd_RecursiveDerefZdd(dd,local_38[0]);
    Cudd_RecursiveDerefZdd(dd,local_48);
    Cudd_RecursiveDerefZdd(dd,local_58);
    Cudd_RecursiveDerefZdd(dd,local_50);
LAB_006358df:
    Cudd_RecursiveDerefZdd(dd,local_60);
    pDVar3 = local_a0;
  }
  else {
    Cudd_Ref(pDVar2);
    pDVar3 = cuddZddProduct(dd,local_38[0],local_60);
    if (pDVar3 == (DdNode *)0x0) {
      Cudd_RecursiveDerefZdd(dd,local_40);
      Cudd_RecursiveDerefZdd(dd,local_38[0]);
      Cudd_RecursiveDerefZdd(dd,local_48);
      Cudd_RecursiveDerefZdd(dd,local_58);
      Cudd_RecursiveDerefZdd(dd,local_50);
      Cudd_RecursiveDerefZdd(dd,local_60);
      n = local_a0;
    }
    else {
      Cudd_Ref(pDVar3);
      n = cuddZddProduct(dd,local_48,local_50);
      if (n == (DdNode *)0x0) {
        Cudd_RecursiveDerefZdd(dd,local_40);
        Cudd_RecursiveDerefZdd(dd,local_38[0]);
        Cudd_RecursiveDerefZdd(dd,local_48);
        Cudd_RecursiveDerefZdd(dd,local_58);
        Cudd_RecursiveDerefZdd(dd,local_50);
        Cudd_RecursiveDerefZdd(dd,local_60);
        Cudd_RecursiveDerefZdd(dd,local_a0);
        Cudd_RecursiveDerefZdd(dd,pDVar2);
        goto LAB_006354d9;
      }
      Cudd_Ref(n);
      Cudd_RecursiveDerefZdd(dd,local_38[0]);
      Cudd_RecursiveDerefZdd(dd,local_50);
      pDVar4 = cuddZddUnion(dd,pDVar2,pDVar3);
      if (pDVar4 == (DdNode *)0x0) {
        Cudd_RecursiveDerefZdd(dd,local_40);
        Cudd_RecursiveDerefZdd(dd,local_48);
        Cudd_RecursiveDerefZdd(dd,local_58);
        Cudd_RecursiveDerefZdd(dd,local_60);
        Cudd_RecursiveDerefZdd(dd,local_a0);
        Cudd_RecursiveDerefZdd(dd,pDVar2);
        Cudd_RecursiveDerefZdd(dd,pDVar3);
        pDVar3 = n;
        goto LAB_006354d9;
      }
      Cudd_Ref(pDVar4);
      Cudd_RecursiveDerefZdd(dd,pDVar2);
      Cudd_RecursiveDerefZdd(dd,pDVar3);
      pDVar2 = cuddZddUnion(dd,pDVar4,n);
      if (pDVar2 == (DdNode *)0x0) {
        Cudd_RecursiveDerefZdd(dd,local_40);
        Cudd_RecursiveDerefZdd(dd,local_48);
        Cudd_RecursiveDerefZdd(dd,local_58);
        Cudd_RecursiveDerefZdd(dd,local_60);
        Cudd_RecursiveDerefZdd(dd,local_a0);
        pDVar2 = pDVar4;
      }
      else {
        Cudd_Ref(pDVar2);
        Cudd_RecursiveDerefZdd(dd,pDVar4);
        Cudd_RecursiveDerefZdd(dd,n);
        n = cuddZddGetNode(dd,v | 1,pDVar2,local_a0);
        if (n == (DdNode *)0x0) {
          Cudd_RecursiveDerefZdd(dd,local_40);
          Cudd_RecursiveDerefZdd(dd,local_48);
          Cudd_RecursiveDerefZdd(dd,local_58);
          Cudd_RecursiveDerefZdd(dd,local_60);
          n = local_a0;
        }
        else {
          Cudd_Ref(n);
          Cudd_RecursiveDerefZdd(dd,pDVar2);
          Cudd_RecursiveDerefZdd(dd,local_a0);
          pDVar2 = cuddZddProduct(dd,local_40,local_58);
          if (pDVar2 == (DdNode *)0x0) {
            Cudd_RecursiveDerefZdd(dd,local_40);
            Cudd_RecursiveDerefZdd(dd,local_48);
            Cudd_RecursiveDerefZdd(dd,local_58);
            Cudd_RecursiveDerefZdd(dd,local_60);
            pDVar3 = n;
            goto LAB_006354d9;
          }
          Cudd_Ref(pDVar2);
          pDVar3 = cuddZddProduct(dd,local_40,local_60);
          if (pDVar3 == (DdNode *)0x0) {
            Cudd_RecursiveDerefZdd(dd,local_40);
            Cudd_RecursiveDerefZdd(dd,local_48);
            Cudd_RecursiveDerefZdd(dd,local_58);
            Cudd_RecursiveDerefZdd(dd,local_60);
          }
          else {
            Cudd_Ref(pDVar3);
            local_a0 = cuddZddProduct(dd,local_48,local_58);
            if (local_a0 == (DdNode *)0x0) {
              Cudd_RecursiveDerefZdd(dd,local_40);
              Cudd_RecursiveDerefZdd(dd,local_48);
              Cudd_RecursiveDerefZdd(dd,local_58);
              Cudd_RecursiveDerefZdd(dd,local_60);
              Cudd_RecursiveDerefZdd(dd,n);
              Cudd_RecursiveDerefZdd(dd,pDVar2);
              goto LAB_006354d9;
            }
            Cudd_Ref(local_a0);
            Cudd_RecursiveDerefZdd(dd,local_40);
            Cudd_RecursiveDerefZdd(dd,local_58);
            Cudd_RecursiveDerefZdd(dd,local_48);
            Cudd_RecursiveDerefZdd(dd,local_60);
            pDVar4 = cuddZddUnion(dd,pDVar2,pDVar3);
            if (pDVar4 == (DdNode *)0x0) {
              Cudd_RecursiveDerefZdd(dd,n);
              Cudd_RecursiveDerefZdd(dd,pDVar2);
              local_60 = pDVar3;
              goto LAB_006358df;
            }
            Cudd_Ref(pDVar4);
            Cudd_RecursiveDerefZdd(dd,pDVar2);
            Cudd_RecursiveDerefZdd(dd,pDVar3);
            pDVar2 = cuddZddUnion(dd,pDVar4,local_a0);
            if (pDVar2 == (DdNode *)0x0) {
              Cudd_RecursiveDerefZdd(dd,n);
              local_50 = local_a0;
              local_60 = pDVar4;
              goto LAB_0063588a;
            }
            Cudd_Ref(pDVar2);
            Cudd_RecursiveDerefZdd(dd,pDVar4);
            Cudd_RecursiveDerefZdd(dd,local_a0);
            pDVar3 = cuddZddGetNode(dd,v & 0xfffffffe,pDVar2,n);
            if (pDVar3 != (DdNode *)0x0) {
              Cudd_Ref(pDVar3);
              Cudd_RecursiveDerefZdd(dd,pDVar2);
              Cudd_RecursiveDerefZdd(dd,n);
              cuddCacheInsert2(dd,cuddZddProduct,f_00,f,pDVar3);
              Cudd_Deref(pDVar3);
              return pDVar3;
            }
          }
        }
      }
    }
    Cudd_RecursiveDerefZdd(dd,n);
    pDVar3 = pDVar2;
  }
LAB_006354d9:
  Cudd_RecursiveDerefZdd(dd,pDVar3);
  return (DdNode *)0x0;
}

Assistant:

DdNode  *
cuddZddProduct(
  DdManager * dd,
  DdNode * f,
  DdNode * g)
{
    int         v, top_f, top_g;
    DdNode      *tmp, *term1, *term2, *term3;
    DdNode      *f0, *f1, *fd, *g0, *g1, *gd;
    DdNode      *R0, *R1, *Rd, *N0, *N1;
    DdNode      *r;
    DdNode      *one = DD_ONE(dd);
    DdNode      *zero = DD_ZERO(dd);
    int         flag;
    int         pv, nv;

    statLine(dd);
    if (f == zero || g == zero)
        return(zero);
    if (f == one)
        return(g);
    if (g == one)
        return(f);

    top_f = dd->permZ[f->index];
    top_g = dd->permZ[g->index];

    if (top_f > top_g)
        return(cuddZddProduct(dd, g, f));

    /* Check cache */
    r = cuddCacheLookup2Zdd(dd, cuddZddProduct, f, g);
    if (r)
        return(r);

    v = f->index;       /* either yi or zi */
    flag = cuddZddGetCofactors3(dd, f, v, &f1, &f0, &fd);
    if (flag == 1)
        return(NULL);
    Cudd_Ref(f1);
    Cudd_Ref(f0);
    Cudd_Ref(fd);
    flag = cuddZddGetCofactors3(dd, g, v, &g1, &g0, &gd);
    if (flag == 1) {
        Cudd_RecursiveDerefZdd(dd, f1);
        Cudd_RecursiveDerefZdd(dd, f0);
        Cudd_RecursiveDerefZdd(dd, fd);
        return(NULL);
    }
    Cudd_Ref(g1);
    Cudd_Ref(g0);
    Cudd_Ref(gd);
    pv = cuddZddGetPosVarIndex(dd, v);
    nv = cuddZddGetNegVarIndex(dd, v);

    Rd = cuddZddProduct(dd, fd, gd);
    if (Rd == NULL) {
        Cudd_RecursiveDerefZdd(dd, f1);
        Cudd_RecursiveDerefZdd(dd, f0);
        Cudd_RecursiveDerefZdd(dd, fd);
        Cudd_RecursiveDerefZdd(dd, g1);
        Cudd_RecursiveDerefZdd(dd, g0);
        Cudd_RecursiveDerefZdd(dd, gd);
        return(NULL);
    }
    Cudd_Ref(Rd);

    term1 = cuddZddProduct(dd, f0, g0);
    if (term1 == NULL) {
        Cudd_RecursiveDerefZdd(dd, f1);
        Cudd_RecursiveDerefZdd(dd, f0);
        Cudd_RecursiveDerefZdd(dd, fd);
        Cudd_RecursiveDerefZdd(dd, g1);
        Cudd_RecursiveDerefZdd(dd, g0);
        Cudd_RecursiveDerefZdd(dd, gd);
        Cudd_RecursiveDerefZdd(dd, Rd);
        return(NULL);
    }
    Cudd_Ref(term1);
    term2 = cuddZddProduct(dd, f0, gd);
    if (term2 == NULL) {
        Cudd_RecursiveDerefZdd(dd, f1);
        Cudd_RecursiveDerefZdd(dd, f0);
        Cudd_RecursiveDerefZdd(dd, fd);
        Cudd_RecursiveDerefZdd(dd, g1);
        Cudd_RecursiveDerefZdd(dd, g0);
        Cudd_RecursiveDerefZdd(dd, gd);
        Cudd_RecursiveDerefZdd(dd, Rd);
        Cudd_RecursiveDerefZdd(dd, term1);
        return(NULL);
    }
    Cudd_Ref(term2);
    term3 = cuddZddProduct(dd, fd, g0);
    if (term3 == NULL) {
        Cudd_RecursiveDerefZdd(dd, f1);
        Cudd_RecursiveDerefZdd(dd, f0);
        Cudd_RecursiveDerefZdd(dd, fd);
        Cudd_RecursiveDerefZdd(dd, g1);
        Cudd_RecursiveDerefZdd(dd, g0);
        Cudd_RecursiveDerefZdd(dd, gd);
        Cudd_RecursiveDerefZdd(dd, Rd);
        Cudd_RecursiveDerefZdd(dd, term1);
        Cudd_RecursiveDerefZdd(dd, term2);
        return(NULL);
    }
    Cudd_Ref(term3);
    Cudd_RecursiveDerefZdd(dd, f0);
    Cudd_RecursiveDerefZdd(dd, g0);
    tmp = cuddZddUnion(dd, term1, term2);
    if (tmp == NULL) {
        Cudd_RecursiveDerefZdd(dd, f1);
        Cudd_RecursiveDerefZdd(dd, fd);
        Cudd_RecursiveDerefZdd(dd, g1);
        Cudd_RecursiveDerefZdd(dd, gd);
        Cudd_RecursiveDerefZdd(dd, Rd);
        Cudd_RecursiveDerefZdd(dd, term1);
        Cudd_RecursiveDerefZdd(dd, term2);
        Cudd_RecursiveDerefZdd(dd, term3);
        return(NULL);
    }
    Cudd_Ref(tmp);
    Cudd_RecursiveDerefZdd(dd, term1);
    Cudd_RecursiveDerefZdd(dd, term2);
    R0 = cuddZddUnion(dd, tmp, term3);
    if (R0 == NULL) {
        Cudd_RecursiveDerefZdd(dd, f1);
        Cudd_RecursiveDerefZdd(dd, fd);
        Cudd_RecursiveDerefZdd(dd, g1);
        Cudd_RecursiveDerefZdd(dd, gd);
        Cudd_RecursiveDerefZdd(dd, Rd);
        Cudd_RecursiveDerefZdd(dd, term3);
        Cudd_RecursiveDerefZdd(dd, tmp);
        return(NULL);
    }
    Cudd_Ref(R0);
    Cudd_RecursiveDerefZdd(dd, tmp);
    Cudd_RecursiveDerefZdd(dd, term3);
    N0 = cuddZddGetNode(dd, nv, R0, Rd); /* nv = zi */
    if (N0 == NULL) {
        Cudd_RecursiveDerefZdd(dd, f1);
        Cudd_RecursiveDerefZdd(dd, fd);
        Cudd_RecursiveDerefZdd(dd, g1);
        Cudd_RecursiveDerefZdd(dd, gd);
        Cudd_RecursiveDerefZdd(dd, Rd);
        Cudd_RecursiveDerefZdd(dd, R0);
        return(NULL);
    }
    Cudd_Ref(N0);
    Cudd_RecursiveDerefZdd(dd, R0);
    Cudd_RecursiveDerefZdd(dd, Rd);

    term1 = cuddZddProduct(dd, f1, g1);
    if (term1 == NULL) {
        Cudd_RecursiveDerefZdd(dd, f1);
        Cudd_RecursiveDerefZdd(dd, fd);
        Cudd_RecursiveDerefZdd(dd, g1);
        Cudd_RecursiveDerefZdd(dd, gd);
        Cudd_RecursiveDerefZdd(dd, N0);
        return(NULL);
    }
    Cudd_Ref(term1);
    term2 = cuddZddProduct(dd, f1, gd);
    if (term2 == NULL) {
        Cudd_RecursiveDerefZdd(dd, f1);
        Cudd_RecursiveDerefZdd(dd, fd);
        Cudd_RecursiveDerefZdd(dd, g1);
        Cudd_RecursiveDerefZdd(dd, gd);
        Cudd_RecursiveDerefZdd(dd, N0);
        Cudd_RecursiveDerefZdd(dd, term1);
        return(NULL);
    }
    Cudd_Ref(term2);
    term3 = cuddZddProduct(dd, fd, g1);
    if (term3 == NULL) {
        Cudd_RecursiveDerefZdd(dd, f1);
        Cudd_RecursiveDerefZdd(dd, fd);
        Cudd_RecursiveDerefZdd(dd, g1);
        Cudd_RecursiveDerefZdd(dd, gd);
        Cudd_RecursiveDerefZdd(dd, N0);
        Cudd_RecursiveDerefZdd(dd, term1);
        Cudd_RecursiveDerefZdd(dd, term2);
        return(NULL);
    }
    Cudd_Ref(term3);
    Cudd_RecursiveDerefZdd(dd, f1);
    Cudd_RecursiveDerefZdd(dd, g1);
    Cudd_RecursiveDerefZdd(dd, fd);
    Cudd_RecursiveDerefZdd(dd, gd);
    tmp = cuddZddUnion(dd, term1, term2);
    if (tmp == NULL) {
        Cudd_RecursiveDerefZdd(dd, N0);
        Cudd_RecursiveDerefZdd(dd, term1);
        Cudd_RecursiveDerefZdd(dd, term2);
        Cudd_RecursiveDerefZdd(dd, term3);
        return(NULL);
    }
    Cudd_Ref(tmp);
    Cudd_RecursiveDerefZdd(dd, term1);
    Cudd_RecursiveDerefZdd(dd, term2);
    R1 = cuddZddUnion(dd, tmp, term3);
    if (R1 == NULL) {
        Cudd_RecursiveDerefZdd(dd, N0);
        Cudd_RecursiveDerefZdd(dd, term3);
        Cudd_RecursiveDerefZdd(dd, tmp);
        return(NULL);
    }
    Cudd_Ref(R1);
    Cudd_RecursiveDerefZdd(dd, tmp);
    Cudd_RecursiveDerefZdd(dd, term3);
    N1 = cuddZddGetNode(dd, pv, R1, N0); /* pv = yi */
    if (N1 == NULL) {
        Cudd_RecursiveDerefZdd(dd, N0);
        Cudd_RecursiveDerefZdd(dd, R1);
        return(NULL);
    }
    Cudd_Ref(N1);
    Cudd_RecursiveDerefZdd(dd, R1);
    Cudd_RecursiveDerefZdd(dd, N0);

    cuddCacheInsert2(dd, cuddZddProduct, f, g, N1);
    Cudd_Deref(N1);
    return(N1);

}